

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptorProto::ServiceDescriptorProto(ServiceDescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ServiceDescriptorProto_00680b00;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->method_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->method_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->method_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->method_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_ServiceDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl
              (&scc_info_ServiceDescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (ServiceOptions *)0x0;
  return;
}

Assistant:

ServiceDescriptorProto::ServiceDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.ServiceDescriptorProto)
}